

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicInputCase9::Run(BasicInputCase9 *this)

{
  float *pfVar1;
  long lVar2;
  Vector<float,_4> local_124;
  Vector<float,_4> local_114;
  Vector<float,_4> local_104;
  Vector<float,_4> local_f4;
  Vector<float,_4> local_e4;
  Vector<float,_4> local_d4;
  Vector<float,_4> local_c4;
  Vector<float,_4> local_b4;
  Vector<float,_4> local_a4;
  Vector<float,_4> local_94;
  Vector<float,_4> local_84;
  Vector<float,_4> local_74;
  Vector<float,_4> local_64;
  Vector<float,_4> local_54;
  Vector<float,_4> local_44;
  Vector<float,_4> local_34;
  Vector<float,_4> local_24;
  uint local_14;
  BasicInputCase9 *pBStack_10;
  GLuint i;
  BasicInputCase9 *this_local;
  
  pBStack_10 = this;
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    glu::CallLogWrapper::glVertexAttrib4f
              (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
                super_GLWrapper.super_CallLogWrapper,local_14,0.0,0.0,0.0,0.0);
  }
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,this->m_vbo[0]);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x30,(void *)0x0,0x88e4);
  tcu::Vector<float,_4>::Vector(&local_24,1.0,2.0,3.0,4.0);
  pfVar1 = tcu::Vector<float,_4>::operator[](&local_24,0);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0,0x10,pfVar1);
  tcu::Vector<float,_4>::Vector(&local_34,5.0,6.0,7.0,8.0);
  pfVar1 = tcu::Vector<float,_4>::operator[](&local_34,0);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x10,0x10,pfVar1);
  tcu::Vector<float,_4>::Vector(&local_44,9.0,10.0,11.0,12.0);
  pfVar1 = tcu::Vector<float,_4>::operator[](&local_44,0);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x20,0x10,pfVar1);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,this->m_vbo[1]);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x30,(void *)0x0,0x88e4);
  tcu::Vector<float,_4>::Vector(&local_54,10.0,20.0,30.0,40.0);
  pfVar1 = tcu::Vector<float,_4>::operator[](&local_54,0);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0,0x10,pfVar1);
  tcu::Vector<float,_4>::Vector(&local_64,50.0,60.0,70.0,80.0);
  pfVar1 = tcu::Vector<float,_4>::operator[](&local_64,0);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x10,0x10,pfVar1);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,this->m_vao);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,4,0x1406,'\0',0);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,2,4,0x1406,'\0',0);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,4,2,0x1406,'\0',4);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,0);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,2,1);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,4,3);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,2);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,4);
  glu::CallLogWrapper::glBindVertexBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,this->m_vbo[0],0,0x10);
  glu::CallLogWrapper::glBindVertexBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,1,this->m_vbo[0],0,0x10);
  glu::CallLogWrapper::glBindVertexBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,3,this->m_vbo[1],4,8);
  glu::CallLogWrapper::glVertexBindingDivisor
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,1,1);
  (this->super_BasicInputBase).instance_count = 2;
  (this->super_BasicInputBase).base_instance = 0;
  tcu::Vector<float,_4>::Vector(&local_74,1.0,2.0,3.0,4.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0].m_data = local_74.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0].m_data + 2) = local_74.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_84,1.0,2.0,3.0,4.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[2].m_data = local_84.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[2].m_data + 2) = local_84.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_94,30.0,40.0,0.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[4].m_data = local_94.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[4].m_data + 2) = local_94.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_a4,5.0,6.0,7.0,8.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x10].m_data = local_a4.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x10].m_data + 2) =
       local_a4.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_b4,1.0,2.0,3.0,4.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x12].m_data = local_b4.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x12].m_data + 2) =
       local_b4.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_c4,50.0,60.0,0.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x14].m_data = local_c4.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x14].m_data + 2) =
       local_c4.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_d4,1.0,2.0,3.0,4.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x20].m_data = local_d4.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x20].m_data + 2) =
       local_d4.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_e4,5.0,6.0,7.0,8.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x22].m_data = local_e4.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x22].m_data + 2) =
       local_e4.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_f4,30.0,40.0,0.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x24].m_data = local_f4.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x24].m_data + 2) =
       local_f4.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_104,5.0,6.0,7.0,8.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x30].m_data = local_104.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x30].m_data + 2) =
       local_104.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_114,5.0,6.0,7.0,8.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x32].m_data = local_114.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x32].m_data + 2) =
       local_114.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_124,50.0,60.0,0.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x34].m_data = local_124.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x34].m_data + 2) =
       local_124.m_data._8_8_;
  lVar2 = BasicInputBase::Run(&this->super_BasicInputBase);
  return lVar2;
}

Assistant:

virtual long Run()
	{
		for (GLuint i = 0; i < 16; ++i)
		{
			glVertexAttrib4f(i, 0.0f, 0.0f, 0.0f, 0.0f);
		}
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[0]);
		glBufferData(GL_ARRAY_BUFFER, sizeof(Vec4) * 3, NULL, GL_STATIC_DRAW);
		glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(Vec4), &Vec4(1.0f, 2.0f, 3.0f, 4.0f)[0]);
		glBufferSubData(GL_ARRAY_BUFFER, 16, sizeof(Vec4), &Vec4(5.0f, 6.0f, 7.0f, 8.0f)[0]);
		glBufferSubData(GL_ARRAY_BUFFER, 32, sizeof(Vec4), &Vec4(9.0f, 10.0f, 11.0f, 12.0f)[0]);
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[1]);
		glBufferData(GL_ARRAY_BUFFER, sizeof(Vec4) * 3, NULL, GL_STATIC_DRAW);
		glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(Vec4), &Vec4(10.0f, 20.0f, 30.0f, 40.0f)[0]);
		glBufferSubData(GL_ARRAY_BUFFER, 16, sizeof(Vec4), &Vec4(50.0f, 60.0f, 70.0f, 80.0f)[0]);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);
		glVertexAttribFormat(0, 4, GL_FLOAT, GL_FALSE, 0);
		glVertexAttribFormat(2, 4, GL_FLOAT, GL_FALSE, 0);
		glVertexAttribFormat(4, 2, GL_FLOAT, GL_FALSE, 4);
		glVertexAttribBinding(0, 0);
		glVertexAttribBinding(2, 1);
		glVertexAttribBinding(4, 3);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(2);
		glEnableVertexAttribArray(4);
		glBindVertexBuffer(0, m_vbo[0], 0, 16);
		glBindVertexBuffer(1, m_vbo[0], 0, 16);
		glBindVertexBuffer(3, m_vbo[1], 4, 8);
		glVertexBindingDivisor(1, 1);

		instance_count		  = 2;
		base_instance		  = 0;
		expected_data[0]	  = Vec4(1.0f, 2.0f, 3.0f, 4.0f);
		expected_data[2]	  = Vec4(1.0f, 2.0f, 3.0f, 4.0f);
		expected_data[4]	  = Vec4(30.0f, 40.0f, 0.0f, 1.0f);
		expected_data[0 + 16] = Vec4(5.0f, 6.0f, 7.0f, 8.0f);
		expected_data[2 + 16] = Vec4(1.0f, 2.0f, 3.0f, 4.0f);
		expected_data[4 + 16] = Vec4(50.0f, 60.0f, 0.0f, 1.0f);

		expected_data[0 + 32]	  = Vec4(1.0f, 2.0f, 3.0f, 4.0f);
		expected_data[2 + 32]	  = Vec4(5.0f, 6.0f, 7.0f, 8.0f);
		expected_data[4 + 32]	  = Vec4(30.0f, 40.0f, 0.0f, 1.0f);
		expected_data[0 + 16 + 32] = Vec4(5.0f, 6.0f, 7.0f, 8.0f);
		expected_data[2 + 16 + 32] = Vec4(5.0f, 6.0f, 7.0f, 8.0f);
		expected_data[4 + 16 + 32] = Vec4(50.0f, 60.0f, 0.0f, 1.0f);
		return BasicInputBase::Run();
	}